

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::IsFileDescriptorProto(FileDescriptor *file,Options *options)

{
  bool bVar1;
  int iVar2;
  Descriptor *this;
  DescriptorStringView __lhs;
  Options *in_RCX;
  string_view pc;
  int local_e4;
  int i;
  AlphaNum local_d0;
  AlphaNum local_90;
  undefined1 local_60 [64];
  Options *local_20;
  Options *options_local;
  FileDescriptor *file_local;
  
  local_20 = options;
  options_local = (Options *)file;
  Namespace_abi_cxx11_((string *)(local_60 + 0x20),(cpp *)file,(FileDescriptor *)options,in_RCX);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_90,"::");
  pc = ProtobufNamespace(local_20);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_d0,pc);
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_60,&local_90);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_60 + 0x20),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(local_60 + 0x20));
  if (!bVar1) {
    for (local_e4 = 0; iVar2 = FileDescriptor::message_type_count((FileDescriptor *)options_local),
        local_e4 < iVar2; local_e4 = local_e4 + 1) {
      this = FileDescriptor::message_type((FileDescriptor *)options_local,local_e4);
      __lhs = Descriptor::name_abi_cxx11_(this);
      bVar1 = std::operator==(__lhs,"FileDescriptorProto");
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool IsFileDescriptorProto(const FileDescriptor* file, const Options& options) {
  if (Namespace(file, options) !=
      absl::StrCat("::", ProtobufNamespace(options))) {
    return false;
  }
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (file->message_type(i)->name() == "FileDescriptorProto") return true;
  }
  return false;
}